

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

lyd_node * moveto_axis_node_next_dfs_backward(lyd_node *iter,lyd_node *stop)

{
  lyd_node *plVar1;
  lyd_node *plVar2;
  bool bVar3;
  lyd_node *local_30;
  lyd_node *local_28;
  lyd_node *next;
  lyd_node *stop_local;
  lyd_node *iter_local;
  
  if (iter->prev->next == (lyd_node *)0x0) {
    local_30 = (lyd_node *)0x0;
  }
  else {
    local_30 = iter->prev;
  }
  local_28 = local_30;
  while( true ) {
    bVar3 = false;
    if (local_28 != (lyd_node *)0x0) {
      plVar1 = lyd_child(local_28);
      bVar3 = plVar1 != (lyd_node *)0x0;
    }
    if (!bVar3) break;
    plVar1 = lyd_child(local_28);
    local_28 = plVar1->prev;
  }
  if (local_28 == (lyd_node *)0x0) {
    local_28 = lyd_parent(iter);
    if ((stop == (lyd_node *)0x0) && (local_28 == (lyd_node *)0x0)) {
      return (lyd_node *)0x0;
    }
    if (stop != (lyd_node *)0x0) {
      plVar1 = lyd_parent(local_28);
      plVar2 = lyd_parent(stop);
      if (plVar1 == plVar2) {
        return (lyd_node *)0x0;
      }
    }
  }
  return local_28;
}

Assistant:

static const struct lyd_node *
moveto_axis_node_next_dfs_backward(const struct lyd_node *iter, const struct lyd_node *stop)
{
    const struct lyd_node *next = NULL;

    /* 1) previous sibling innermost last child */
    next = iter->prev->next ? iter->prev : NULL;
    while (next && lyd_child(next)) {
        next = lyd_child(next);
        next = next->prev;
    }

    if (!next) {
        /* 2) parent */
        iter = lyd_parent(iter);
        if ((!stop && !iter) || (stop && (lyd_parent(iter) == lyd_parent(stop)))) {
            return NULL;
        }
        next = iter;
    }

    return next;
}